

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v6::internal::format_value<char,Query>(buffer<char> *buf,Query *value,locale_ref loc)

{
  bool bVar1;
  buffer<char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> output;
  formatbuf<char> format_buf;
  buffer<char> *in_stack_fffffffffffffe48;
  formatbuf<char> *in_stack_fffffffffffffe50;
  buffer<char> *this;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  locale local_190 [8];
  locale local_188 [24];
  buffer<char> local_170;
  Query *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  streambuf local_60 [80];
  buffer<char> *local_10;
  locale_ref local_8;
  
  local_10 = in_RDI;
  formatbuf<char>::formatbuf(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::ostream::ostream(&local_170,local_60);
  bVar1 = locale_ref::operator_cast_to_bool(&local_8);
  if (bVar1) {
    locale_ref::get<std::locale>
              ((locale_ref *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::ios::imbue(local_188);
    std::locale::~locale(local_188);
    std::locale::~locale(local_190);
  }
  this = (buffer<char> *)(local_170._vptr_buffer[-3] + (long)&local_170._vptr_buffer);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((_Ios_Iostate)this);
  operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  buffer<char>::size(local_10);
  buffer<char>::resize(this,(size_t)local_10);
  std::ostream::~ostream(&local_170);
  formatbuf<char>::~formatbuf((formatbuf<char> *)0x1840e8);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
  if (loc) output.imbue(loc.get<std::locale>());
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buf.resize(buf.size());
}